

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O3

void __thiscall
highwayhash::HighwayHashCatTest<1U>::operator()
          (HighwayHashCatTest<1U> *this,HHKey *key,char *bytes,uint64_t size,HHResult64 *expected,
          HHNotify notify)

{
  ulong *puVar1;
  ulong uVar2;
  undefined4 uVar3;
  ulong __n;
  uint64_t uVar4;
  uint64_t uVar5;
  void *pvVar6;
  long lVar7;
  uint64_t *puVar8;
  uint64_t *__src;
  char *pcVar9;
  size_t __n_00;
  size_t __n_01;
  ulong uVar10;
  ulong __n_02;
  uint64_t *puVar11;
  char *pcVar12;
  HHStatePortable *pHVar13;
  ulong uVar14;
  uint64_t *puVar15;
  ulong uVar16;
  size_t i;
  size_t size_00;
  byte bVar17;
  HHPacket tmp;
  HHStateT<1> state_flat;
  Lanes rotated_keys;
  uint64_t local_220;
  uint64_t uStack_218;
  uint64_t local_210;
  uint64_t uStack_208;
  uint64_t local_200;
  uint64_t uStack_1f8;
  uint64_t local_1f0;
  uint64_t uStack_1e8;
  HHNotify local_1c8;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  uint64_t local_1a0;
  ulong auStack_198 [3];
  ulong local_180;
  ulong uStack_178;
  uint64_t local_170;
  uint64_t uStack_168;
  uint64_t local_160;
  uint64_t uStack_158;
  uint64_t local_150;
  uint64_t uStack_148;
  uint64_t local_140;
  uint64_t uStack_138;
  uint64_t local_130;
  uint64_t uStack_128;
  size_t local_120;
  HHStatePortable local_100;
  
  bVar17 = 0;
  size_00 = 0;
  local_1c8 = notify;
  pvVar6 = operator_new__(-(ulong)(size + 1 >> 0x3d != 0) | size * 8 + 8);
  do {
    lVar7 = 0;
    do {
      puVar8 = *key + lVar7;
      uVar4 = *puVar8;
      uVar5 = puVar8[1];
      uVar3 = *(undefined4 *)((long)puVar8 + 0xc);
      *(undefined4 *)(local_100.v0 + lVar7) = *(undefined4 *)((long)puVar8 + 4);
      *(int *)((long)local_100.v0 + lVar7 * 8 + 4) = (int)uVar4;
      *(undefined4 *)(local_100.v0 + lVar7 + 1) = uVar3;
      *(int *)((long)local_100.v0 + lVar7 * 8 + 0xc) = (int)uVar5;
      lVar7 = lVar7 + 2;
    } while (lVar7 != 4);
    local_170 = 0x13198a2e03707344;
    uStack_168 = 0x243f6a8885a308d3;
    local_180 = 0xdbe6d5d5fe4cce2f;
    uStack_178 = 0xa4093822299f31d0;
    local_160 = 0x3bd39e10cb0ef593;
    uStack_158 = 0xc0acf169b5f18a8c;
    local_150 = 0xbe5466cf34e90c6c;
    uStack_148 = 0x452821e638d01377;
    lVar7 = 0;
    do {
      puVar1 = (ulong *)((long)*key + lVar7);
      uVar2 = puVar1[1];
      uVar16 = *(ulong *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 + lVar7 + 8)
      ;
      *(ulong *)(local_1c0 + lVar7) =
           *puVar1 ^ *(ulong *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                               lVar7);
      *(ulong *)(local_1c0 + lVar7 + 8) = uVar2 ^ uVar16;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x20);
    lVar7 = 0;
    do {
      uVar2 = *(ulong *)((long)local_100.v0 + lVar7 + 8);
      uVar16 = *(ulong *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 + lVar7 + 8)
      ;
      *(ulong *)((long)&local_1a0 + lVar7) =
           *(ulong *)((long)local_100.v0 + lVar7) ^
           *(ulong *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 + lVar7);
      *(ulong *)((long)auStack_198 + lVar7) = uVar2 ^ uVar16;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x20);
    HighwayHashT<highwayhash::Portable::HHStatePortable,unsigned_long>
              ((HHStatePortable *)local_1c0,bytes,size_00,
               (unsigned_long *)((long)pvVar6 + size_00 * 8));
    size_00 = size_00 + 1;
  } while (size_00 <= size);
  if (2 < size) {
    uVar2 = size / 3;
    uVar16 = 0;
    do {
      puVar8 = (uint64_t *)(bytes + uVar16);
      __n_01 = 0;
      do {
        __src = (uint64_t *)((long)puVar8 + __n_01);
        __n_02 = 0;
        do {
          lVar7 = 0;
          do {
            puVar15 = *key + lVar7;
            uVar4 = *puVar15;
            uVar5 = puVar15[1];
            uVar3 = *(undefined4 *)((long)puVar15 + 0xc);
            *(undefined4 *)(local_100.v0 + lVar7) = *(undefined4 *)((long)puVar15 + 4);
            *(int *)((long)local_100.v0 + lVar7 * 8 + 4) = (int)uVar4;
            *(undefined4 *)(local_100.v0 + lVar7 + 1) = uVar3;
            *(int *)((long)local_100.v0 + lVar7 * 8 + 0xc) = (int)uVar5;
            lVar7 = lVar7 + 2;
          } while (lVar7 != 4);
          local_150 = 0x13198a2e03707344;
          uStack_148 = 0x243f6a8885a308d3;
          local_160 = 0xdbe6d5d5fe4cce2f;
          uStack_158 = 0xa4093822299f31d0;
          local_140 = 0x3bd39e10cb0ef593;
          uStack_138 = 0xc0acf169b5f18a8c;
          local_130 = 0xbe5466cf34e90c6c;
          uStack_128 = 0x452821e638d01377;
          lVar7 = 0;
          do {
            puVar1 = (ulong *)((long)*key + lVar7);
            uVar14 = puVar1[1];
            uVar10 = *(ulong *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                               lVar7 + 8);
            *(ulong *)((long)&local_1a0 + lVar7) =
                 *puVar1 ^ *(ulong *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init0
                                     + lVar7);
            *(ulong *)((long)auStack_198 + lVar7) = uVar14 ^ uVar10;
            lVar7 = lVar7 + 0x10;
          } while (lVar7 != 0x20);
          lVar7 = 0;
          do {
            uVar14 = *(ulong *)((long)local_100.v0 + lVar7 + 8);
            uVar10 = *(ulong *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                               lVar7 + 8);
            *(ulong *)((long)&local_180 + lVar7) =
                 *(ulong *)((long)local_100.v0 + lVar7) ^
                 *(ulong *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 + lVar7);
            *(ulong *)((long)&uStack_178 + lVar7) = uVar14 ^ uVar10;
            lVar7 = lVar7 + 0x10;
          } while (lVar7 != 0x20);
          local_120 = 0;
          local_1c0 = (undefined1  [16])0x0;
          local_1b0 = (undefined1  [16])0x0;
          if (uVar16 < 0x20) {
            if (uVar16 == 0) {
              local_120 = 0;
            }
            else {
              memcpy(local_1c0,bytes,uVar16);
            }
            local_120 = local_120 + uVar16;
            __n_00 = local_120;
          }
          else {
            puVar15 = &local_1a0;
            pHVar13 = &local_100;
            for (lVar7 = 0x10; puVar11 = (uint64_t *)bytes, uVar14 = uVar16, lVar7 != 0;
                lVar7 = lVar7 + -1) {
              pHVar13->v0[0] = *puVar15;
              puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
              pHVar13 = (HHStatePortable *)((long)pHVar13 + (ulong)bVar17 * -0x10 + 8);
            }
            do {
              local_220 = *puVar11;
              uStack_218 = puVar11[1];
              local_210 = puVar11[2];
              uStack_208 = puVar11[3];
              Portable::HHStatePortable::Update(&local_100,(Lanes *)&local_220);
              puVar11 = puVar11 + 4;
              uVar14 = uVar14 - 0x20;
            } while (0x1f < uVar14);
            local_120 = uVar14;
            pHVar13 = &local_100;
            puVar15 = &local_1a0;
            for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
              *puVar15 = pHVar13->v0[0];
              pHVar13 = (HHStatePortable *)((long)pHVar13 + (ulong)bVar17 * -0x10 + 8);
              puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
            }
            if (uVar14 == 0) {
              __n_00 = 0;
            }
            else {
              memcpy(local_1c0,puVar11,uVar14);
              __n_00 = local_120;
            }
          }
          uVar14 = 0x20 - __n_00;
          if (__n_01 < uVar14) {
            if (__n_01 != 0) {
              memcpy(local_1c0 + __n_00,puVar8,__n_01);
              __n_00 = local_120;
            }
            local_120 = __n_00 + __n_01;
            uVar14 = __n_00 + __n_01;
          }
          else {
            puVar15 = &local_1a0;
            pHVar13 = &local_100;
            for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
              pHVar13->v0[0] = *puVar15;
              puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
              pHVar13 = (HHStatePortable *)((long)pHVar13 + (ulong)bVar17 * -0x10 + 8);
            }
            uVar10 = __n_01;
            puVar15 = puVar8;
            if (__n_00 != 0) {
              memcpy(&local_200,local_1c0,__n_00);
              if (__n_00 != 0x20) {
                memcpy((void *)((long)&local_200 + __n_00),puVar8,uVar14);
              }
              local_210 = local_1f0;
              uStack_208 = uStack_1e8;
              local_220 = local_200;
              uStack_218 = uStack_1f8;
              Portable::HHStatePortable::Update(&local_100,(Lanes *)&local_220);
              puVar15 = (uint64_t *)(uVar14 + (long)puVar8);
              uVar10 = __n_01 - uVar14;
            }
            for (; 0x1f < uVar10; uVar10 = uVar10 - 0x20) {
              local_220 = *puVar15;
              uStack_218 = puVar15[1];
              local_210 = puVar15[2];
              uStack_208 = puVar15[3];
              Portable::HHStatePortable::Update(&local_100,(Lanes *)&local_220);
              puVar15 = puVar15 + 4;
            }
            local_120 = uVar10;
            pHVar13 = &local_100;
            puVar11 = &local_1a0;
            for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
              *puVar11 = pHVar13->v0[0];
              pHVar13 = (HHStatePortable *)((long)pHVar13 + (ulong)bVar17 * -0x10 + 8);
              puVar11 = puVar11 + (ulong)bVar17 * -2 + 1;
            }
            if (uVar10 == 0) {
              uVar14 = 0;
            }
            else {
              memcpy(local_1c0,puVar15,uVar10);
              uVar14 = local_120;
            }
          }
          uVar10 = 0x20 - uVar14;
          if (__n_02 < uVar10) {
            if (__n_02 != 0) {
              memcpy(local_1c0 + uVar14,__src,__n_02);
              uVar14 = local_120;
            }
            local_120 = uVar14 + __n_02;
          }
          else {
            puVar15 = &local_1a0;
            pHVar13 = &local_100;
            for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
              pHVar13->v0[0] = *puVar15;
              puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
              pHVar13 = (HHStatePortable *)((long)pHVar13 + (ulong)bVar17 * -0x10 + 8);
            }
            __n = __n_02;
            puVar15 = __src;
            if (uVar14 != 0) {
              memcpy(&local_200,local_1c0,uVar14);
              if (uVar14 != 0x20) {
                memcpy((void *)((long)&local_200 + uVar14),__src,uVar10);
              }
              local_210 = local_1f0;
              uStack_208 = uStack_1e8;
              local_220 = local_200;
              uStack_218 = uStack_1f8;
              Portable::HHStatePortable::Update(&local_100,(Lanes *)&local_220);
              puVar15 = (uint64_t *)(uVar10 + (long)__src);
              __n = __n_02 - uVar10;
            }
            for (; 0x1f < __n; __n = __n - 0x20) {
              local_220 = *puVar15;
              uStack_218 = puVar15[1];
              local_210 = puVar15[2];
              uStack_208 = puVar15[3];
              Portable::HHStatePortable::Update(&local_100,(Lanes *)&local_220);
              puVar15 = puVar15 + 4;
            }
            local_120 = __n;
            pHVar13 = &local_100;
            puVar11 = &local_1a0;
            for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
              *puVar11 = pHVar13->v0[0];
              pHVar13 = (HHStatePortable *)((long)pHVar13 + (ulong)bVar17 * -0x10 + 8);
              puVar11 = puVar11 + (ulong)bVar17 * -2 + 1;
            }
            if (__n != 0) {
              memcpy(local_1c0,puVar15,__n);
            }
          }
          HighwayHashCatT<1U>::Finalize<unsigned_long>
                    ((HighwayHashCatT<1U> *)local_1c0,local_100.v0);
          pcVar12 = (char *)((long)__src + (__n_02 - (long)bytes));
          if (*(uint64_t *)((long)pvVar6 + (long)pcVar12 * 8) != local_100.v0[0]) {
            pcVar9 = TargetName(1);
            (*local_1c8)(pcVar9,(size_t)pcVar12);
          }
          __n_02 = __n_02 + 1;
        } while (__n_02 != uVar2);
        __n_01 = __n_01 + 1;
      } while (__n_01 != uVar2);
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar2);
  }
  operator_delete__(pvVar6);
  return;
}

Assistant:

void HighwayHashCatTest<Target>::operator()(const HHKey& key,
                                            const char* HH_RESTRICT bytes,
                                            const uint64_t size,
                                            const HHResult64* expected,
                                            const HHNotify notify) const {
  TestHighwayHashCat(key, bytes, size, expected, notify);
}